

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

FileOptions * __thiscall
ApprovalTests::Options::fileOptions(FileOptions *__return_storage_ptr__,Options *this)

{
  logic_error *this_00;
  int in_ECX;
  void *in_RDX;
  void *in_R8;
  
  if ((this->fileOptions_).options_ == (Options *)0x0) {
    FileOptions::clone(__return_storage_ptr__,(__fn *)this,in_RDX,in_ECX,in_R8);
    __return_storage_ptr__->options_ = this;
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,"Incorrect assumption: A FileOptions has been re-used");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

Options::FileOptions Options::fileOptions() const
    {
        if (fileOptions_.options_ != nullptr)
        {
            throw std::logic_error(
                "Incorrect assumption: A FileOptions has been re-used");
        }
        FileOptions copy = fileOptions_.clone();
        copy.options_ = this;
        return copy;
    }